

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsIsRuntimeExecutionDisabled(JsRuntimeHandle runtimeHandle,bool *isDisabled)

{
  JsErrorCode JVar1;
  size_t sVar2;
  JsrtRuntime *runtime;
  
  if (runtimeHandle != (JsRuntimeHandle)0x0) {
    if (isDisabled == (bool *)0x0) {
      JVar1 = JsErrorNullArgument;
    }
    else {
      *isDisabled = false;
      ThreadContext::ValidateThreadContext(*runtimeHandle);
      sVar2 = ThreadContext::GetStackLimitForCurrentThread(*runtimeHandle);
      *isDisabled = sVar2 == 0x7fffffffffffffff;
      JVar1 = JsNoError;
    }
    return JVar1;
  }
  return JsErrorInvalidArgument;
}

Assistant:

CHAKRA_API JsIsRuntimeExecutionDisabled(_In_ JsRuntimeHandle runtimeHandle, _Out_ bool *isDisabled)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);
    PARAM_NOT_NULL(isDisabled);
    *isDisabled = false;

    ThreadContext* threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    *isDisabled = threadContext->IsExecutionDisabled();
    return JsNoError;
}